

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsCoreSendOrderedCommand(HelicsCore core,char *target,char *command,HelicsError *err)

{
  Core *pCVar1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  undefined4 uStack_58;
  undefined1 local_40 [16];
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (target != (char *)0x0) {
      sVar2 = strlen(target);
      _Var5._M_p = target;
    }
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (command != (char *)0x0) {
      sVar3 = strlen(command);
      _Var4._M_p = command;
    }
    local_40[0] = 0;
    uStack_58 = SUB84(local_40,0);
    (*pCVar1->_vptr_Core[0x5b])(pCVar1,sVar2,_Var5._M_p,sVar3,_Var4._M_p,1,0,uStack_58);
  }
  return;
}

Assistant:

void helicsCoreSendOrderedCommand(HelicsCore core, const char* target, const char* command, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->sendCommand(AS_STRING_VIEW(target), AS_STRING_VIEW(command), std::string{}, HELICS_SEQUENCING_MODE_ORDERED);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}